

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

ssize_t ossl_send(Curl_cfilter *cf,Curl_easy *data,void *mem,size_t len,CURLcode *curlcode)

{
  long lVar1;
  CURLcode CVar2;
  uint uVar3;
  int err;
  uint *puVar4;
  char *pcVar5;
  ulong uVar6;
  size_t sVar7;
  char error_buffer [256];
  
  lVar1 = *(long *)((long)cf->ctx + 0x30);
  ERR_clear_error();
  sVar7 = 0x7fffffff;
  if (len < 0x7fffffff) {
    sVar7 = len;
  }
  uVar3 = SSL_write(*(SSL **)(lVar1 + 8),mem,(int)sVar7);
  if ((int)uVar3 < 1) {
    err = SSL_get_error(*(SSL **)(lVar1 + 8),uVar3);
    if (err - 2U < 2) {
      *curlcode = CURLE_AGAIN;
    }
    else {
      if (err == 1) {
        uVar6 = ERR_get_error();
        pcVar5 = ossl_strerror(uVar6,error_buffer,0x100);
        Curl_failf(data,"SSL_write() error: %s",pcVar5);
      }
      else {
        if (err == 5) {
          puVar4 = (uint *)__errno_location();
          if (*(int *)(lVar1 + 0x20) == 0x51) {
            CVar2 = CURLE_AGAIN;
          }
          else {
            uVar3 = *puVar4;
            uVar6 = ERR_get_error();
            if (uVar6 == 0) {
              if (uVar3 == 0) {
                curl_msnprintf(error_buffer,0x100,"%s","SSL_ERROR_SYSCALL");
              }
              else {
                Curl_strerror(uVar3,error_buffer,0x100);
              }
            }
            else {
              ossl_strerror(uVar6,error_buffer,0x100);
            }
            Curl_failf(data,"OpenSSL SSL_write: %s, errno %d",error_buffer,(ulong)uVar3);
            CVar2 = CURLE_SEND_ERROR;
          }
          *curlcode = CVar2;
          return -1;
        }
        pcVar5 = SSL_ERROR_to_str(err);
        puVar4 = (uint *)__errno_location();
        Curl_failf(data,"OpenSSL SSL_write: %s, errno %d",pcVar5,(ulong)*puVar4);
      }
      *curlcode = CURLE_SEND_ERROR;
    }
    return -1;
  }
  *curlcode = CURLE_OK;
  return (ulong)uVar3;
}

Assistant:

static ssize_t ossl_send(struct Curl_cfilter *cf,
                         struct Curl_easy *data,
                         const void *mem,
                         size_t len,
                         CURLcode *curlcode)
{
  /* SSL_write() is said to return 'int' while write() and send() returns
     'size_t' */
  int err;
  char error_buffer[256];
  sslerr_t sslerror;
  int memlen;
  int rc;
  struct ssl_connect_data *connssl = cf->ctx;
  struct ossl_ssl_backend_data *backend =
    (struct ossl_ssl_backend_data *)connssl->backend;

  (void)data;
  DEBUGASSERT(backend);

  ERR_clear_error();

  memlen = (len > (size_t)INT_MAX) ? INT_MAX : (int)len;
  rc = SSL_write(backend->handle, mem, memlen);

  if(rc <= 0) {
    err = SSL_get_error(backend->handle, rc);

    switch(err) {
    case SSL_ERROR_WANT_READ:
    case SSL_ERROR_WANT_WRITE:
      /* The operation did not complete; the same TLS/SSL I/O function
         should be called again later. This is basically an EWOULDBLOCK
         equivalent. */
      *curlcode = CURLE_AGAIN;
      rc = -1;
      goto out;
    case SSL_ERROR_SYSCALL:
    {
      int sockerr = SOCKERRNO;

      if(backend->io_result == CURLE_AGAIN) {
        *curlcode = CURLE_AGAIN;
        rc = -1;
        goto out;
      }
      sslerror = ERR_get_error();
      if(sslerror)
        ossl_strerror(sslerror, error_buffer, sizeof(error_buffer));
      else if(sockerr)
        Curl_strerror(sockerr, error_buffer, sizeof(error_buffer));
      else
        msnprintf(error_buffer, sizeof(error_buffer), "%s",
                  SSL_ERROR_to_str(err));

      failf(data, OSSL_PACKAGE " SSL_write: %s, errno %d",
            error_buffer, sockerr);
      *curlcode = CURLE_SEND_ERROR;
      rc = -1;
      goto out;
    }
    case SSL_ERROR_SSL: {
      /*  A failure in the SSL library occurred, usually a protocol error.
          The OpenSSL error queue contains more information on the error. */
      sslerror = ERR_get_error();
      failf(data, "SSL_write() error: %s",
            ossl_strerror(sslerror, error_buffer, sizeof(error_buffer)));
      *curlcode = CURLE_SEND_ERROR;
      rc = -1;
      goto out;
    }
    default:
      /* a true error */
      failf(data, OSSL_PACKAGE " SSL_write: %s, errno %d",
            SSL_ERROR_to_str(err), SOCKERRNO);
      *curlcode = CURLE_SEND_ERROR;
      rc = -1;
      goto out;
    }
  }
  *curlcode = CURLE_OK;

out:
  return (ssize_t)rc; /* number of bytes */
}